

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

double __thiscall
imrt::ApertureILS::localSearch
          (ApertureILS *this,pair<bool,_std::pair<imrt::Station_*,_int>_> target_beam,Plan *P)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  ApertureILS *this_00;
  double c_eval;
  double local_48;
  value_type local_40;
  
  c_eval = Plan::getEvaluation(P);
  iVar2 = this->ls_type;
  cVar1 = (this->super_ILS).field_0x24;
  if ((this->super_ILS).field_0x25 == '\x01') {
    if (cVar1 == '\0') {
      this_00 = (ApertureILS *)&std::cout;
      std::operator<<((ostream *)&std::cout,", ls aperture ");
    }
    else {
      if (target_beam.first == false) {
        bVar3 = Station::anyClosed(target_beam.second.first,target_beam.second.second);
      }
      else {
        bVar3 = Station::anyOpen(target_beam.second.first,target_beam.second.second);
      }
      iVar4 = rand();
      if ((bVar3 == false) || ((double)iVar4 / 2147483647.0 <= this->prob_intensity)) {
        std::operator<<((ostream *)&std::cout,", ls intensity");
        goto LAB_0012023d;
      }
      this_00 = (ApertureILS *)&std::cout;
      std::operator<<((ostream *)&std::cout,", ls aperture");
    }
    local_48 = improvementAperture(this_00,target_beam.second.second,target_beam.second.first,
                                   (bool)(target_beam.first ^ 1),c_eval,P,iVar2 != 0);
  }
  else {
    if (cVar1 == '\0') {
      poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: Search option not recognized!!!");
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_001202a2;
    }
    std::operator<<((ostream *)&std::cout,", ls intensity ");
LAB_0012023d:
    local_48 = improvementIntensity
                         (this,target_beam.second.second,target_beam.second.first,
                          (bool)(target_beam.first ^ 1),c_eval,P,iVar2 != 0);
  }
  std::operator<<((ostream *)&std::cout,", found: ");
  std::ostream::_M_insert<double>(local_48);
  if (local_48 < c_eval) {
    std::__cxx11::
    list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>::clear
              (&this->tabu);
    return local_48;
  }
LAB_001202a2:
  local_40.first = target_beam.second.first;
  local_40.second = target_beam.second.second;
  std::__cxx11::
  list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>::
  push_back(&this->tabu,&local_40);
  return local_48;
}

Assistant:

double ApertureILS::localSearch(pair<bool, pair<Station*, int>> target_beam, Plan& P) {
  double aux_eval, local_eval=P.getEvaluation();
  bool search_a;
  bool best_improvement=ls_type;
  
  int beamlet = target_beam.second.second;
  Station* s = target_beam.second.first;
  bool sign = target_beam.first;

  if (search_aperture && !search_intensity) {
    cout << ", ls aperture ";
    aux_eval = improvementAperture(beamlet, *s, !sign, local_eval, P, best_improvement);
    cout << ", found: " << aux_eval;
  } else if (!search_aperture && search_intensity) {
    cout << ", ls intensity ";
    aux_eval = improvementIntensity(beamlet, *s, !sign, local_eval, P, best_improvement);
    cout << ", found: " << aux_eval;
  } else if (search_aperture && search_intensity) {
    if (!sign)
      search_a = s->anyClosed(beamlet);
    else 
      search_a = s->anyOpen(beamlet);

    if (((double) rand() / (RAND_MAX)) <= prob_intensity || !search_a) {
      cout << ", ls intensity";
      aux_eval = improvementIntensity(beamlet, *s,  !sign, local_eval, P, best_improvement);
      cout << ", found: " << aux_eval;
    } else {
      cout << ", ls aperture";
      aux_eval = improvementAperture(beamlet, *s, !sign, local_eval, P, best_improvement);
      cout << ", found: " << aux_eval;
    }
  } else {
    cout << "ERROR: Search option not recognized!!!" << endl;
    
  }
  if (local_eval>aux_eval) { 
    tabu.clear();
  }else{
    tabu.push_back(make_pair(s, beamlet));
  }
  return(aux_eval);
}